

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_local(CTcParser *this,int *err)

{
  bool bVar1;
  CTPNStmBase *pCVar2;
  tc_toktyp_t tVar3;
  CTcToken *pCVar4;
  int *err_00;
  CTcPrsNode *pCVar5;
  CTPNStmBase *pCVar6;
  long linenum;
  undefined4 *in_RSI;
  CTcParser *in_RDI;
  CTcPrsNode *expr;
  CTPNStm *stm;
  CTcSymLocal *lcl;
  size_t symlen;
  char *sym;
  CTPNStm *last_stm;
  CTPNStm *first_stm;
  int done;
  undefined4 uVar7;
  int in_stack_ffffffffffffff2c;
  CTcTokenizer *in_stack_ffffffffffffff30;
  CTcTokenizer *in_stack_ffffffffffffff38;
  CTcTokenizer **in_stack_ffffffffffffff40;
  tc_toktyp_t in_stack_ffffffffffffff4c;
  CTPNStmBase *in_stack_ffffffffffffff50;
  CTcTokFileDesc *in_stack_ffffffffffffff58;
  CTPNStmBase *in_stack_ffffffffffffff60;
  CTcPrsSymtab *this_00;
  CTcTokenizer **lcl_00;
  undefined4 in_stack_ffffffffffffff88;
  CTPNStmBase *local_30;
  CTPNStmBase *local_28;
  CTPNStmBase *local_8;
  
  local_30 = (CTPNStmBase *)0x0;
  local_28 = (CTPNStmBase *)0x0;
  CTcTokenizer::next(in_stack_ffffffffffffff38);
  bVar1 = false;
  while (!bVar1) {
    tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2bb6eb);
    if (tVar3 == TOKT_SYM) {
      lcl_00 = &G_tok;
      pCVar4 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text(pCVar4);
      pCVar4 = CTcTokenizer::getcur
                         ((CTcTokenizer *)
                          (((CTcSymLocal *)lcl_00)->super_CTcSymLocalBase).super_CTcSymbol.
                          super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                          _vptr_CVmHashEntry);
      err_00 = (int *)CTcToken::get_text_len(pCVar4);
      this_00 = in_RDI->local_symtab_;
      alloc_local(in_RDI);
      uVar7 = 0;
      CTcPrsSymtab::add_local
                (this_00,(textchar_t *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,(int)lcl_00);
      tVar3 = CTcTokenizer::next(in_stack_ffffffffffffff38);
      pCVar6 = local_30;
      pCVar2 = local_28;
      if ((tVar3 == TOKT_EQ) || (tVar3 == TOKT_ASI)) {
        pCVar5 = parse_local_initializer
                           ((CTcParser *)CONCAT44(tVar3,in_stack_ffffffffffffff88),
                            (CTcSymLocal *)lcl_00,err_00);
        if (pCVar5 == (CTcPrsNode *)0x0) {
          bVar1 = true;
        }
        else {
          pCVar6 = (CTPNStmBase *)CTcPrsAllocObj::operator_new(0x2bb808);
          CTPNStmExpr::CTPNStmExpr
                    ((CTPNStmExpr *)in_stack_ffffffffffffff30,
                     (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffff2c,uVar7));
          in_stack_ffffffffffffff50 = pCVar6;
          in_stack_ffffffffffffff60 = pCVar6;
          in_stack_ffffffffffffff58 = CTcTokenizer::get_last_desc(G_tok);
          linenum = CTcTokenizer::get_last_linenum(G_tok);
          CTPNStmBase::set_source_pos(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,linenum);
          pCVar2 = pCVar6;
          if (local_30 != (CTPNStmBase *)0x0) {
            CTPNStmBase::set_next_stm(local_30,(CTPNStm *)pCVar6);
            pCVar2 = local_28;
          }
        }
      }
      local_28 = pCVar2;
      local_30 = pCVar6;
      in_stack_ffffffffffffff4c = CTcTokenizer::cur((CTcTokenizer *)0x2bb8e8);
      if (in_stack_ffffffffffffff4c == TOKT_SYM) {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      }
      else if (in_stack_ffffffffffffff4c == TOKT_COMMA) {
        CTcTokenizer::next(in_stack_ffffffffffffff38);
      }
      else if (in_stack_ffffffffffffff4c == TOKT_SEM) {
        CTcTokenizer::next(in_stack_ffffffffffffff38);
        bVar1 = true;
      }
      else {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
        bVar1 = true;
      }
    }
    else {
      in_stack_ffffffffffffff40 = &G_tok;
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2bb998);
      if (tVar3 == TOKT_EOF) {
        *in_RSI = 1;
        bVar1 = true;
      }
      else if (tVar3 == TOKT_COMMA) {
        CTcTokenizer::next(in_stack_ffffffffffffff38);
      }
      else if (tVar3 == TOKT_SEM) {
        CTcTokenizer::next(in_stack_ffffffffffffff38);
        bVar1 = true;
      }
      else {
        CTcTokenizer::next(in_stack_ffffffffffffff38);
      }
    }
  }
  if (local_28 == (CTPNStmBase *)0x0) {
    local_8 = (CTPNStmBase *)0x0;
  }
  else if (local_28 == local_30) {
    local_8 = local_28;
  }
  else {
    local_8 = (CTPNStmBase *)CTcPrsAllocObj::operator_new(0x2bba63);
    CTPNStmComp::CTPNStmComp
              ((CTPNStmComp *)in_stack_ffffffffffffff40,(CTPNStm *)local_8,
               (CTcPrsSymtab *)in_stack_ffffffffffffff30);
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_local(int *err)
{
    int done;
    CTPNStm *first_stm;
    CTPNStm *last_stm;

    /* we have no initializer statements yet */
    first_stm = last_stm = 0;

    /* skip the 'local' keyword */
    G_tok->next();

    /* keep going until we reach the closing semicolon */
    for (done = FALSE ; !done ; )
    {
        /* we need a symbol name */
        if (G_tok->cur() == TOKT_SYM)
        {
            const char *sym;
            size_t symlen;
            CTcSymLocal *lcl;
            CTPNStm *stm;
            CTcPrsNode *expr;
            
            /* get the symbol string from the token */
            sym = G_tok->getcur()->get_text();
            symlen = G_tok->getcur()->get_text_len();
            
            /* add the new local variable to our symbol table */
            lcl = local_symtab_->add_local(sym, symlen, alloc_local(),
                                           FALSE, FALSE, FALSE);

            /* skip the symbol and check for an initial value assignment */
            switch (G_tok->next())
            {
            case TOKT_EQ:
            case TOKT_ASI:
                /* parse the initializer */
                expr = parse_local_initializer(lcl, err);

                /* if we didn't get a statement, we can't proceed */
                if (expr == 0)
                {
                    done = TRUE;
                    break;
                }

                /* create a statement for the assignment */
                stm = new CTPNStmExpr(expr);

                /* 
                 *   set the statement's source location according to the
                 *   current source location - if we have multiple
                 *   initializers over several lines, this will allow the
                 *   debugger to step through the individual
                 *   initializations 
                 */
                stm->set_source_pos(G_tok->get_last_desc(),
                                    G_tok->get_last_linenum());

                /* add the statement to our list */
                if (last_stm != 0)
                    last_stm->set_next_stm(stm);
                else
                    first_stm = stm;
                last_stm = stm;

                /* done */
                break;

            default:
                /* there's nothing more to do with this variable */
                break;
            }

            /* 
             *   check what follows - we can have a comma to introduce
             *   another local variable, or a semicolon to end the
             *   statement 
             */
            switch(G_tok->cur())
            {
            case TOKT_COMMA:
                /* skip the comma and go on to the next variable */
                G_tok->next();
                break;

            case TOKT_SEM:
                /* skip the semicolon, and stop scanning */
                G_tok->next();
                done = TRUE;
                break;

            case TOKT_SYM:
                /* 
                 *   they probably just left out a comma - assume the
                 *   comma is there and keep going 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_COMMA);
                break;

            default:
                /* 
                 *   these almost certainly indicate that they left out a
                 *   semicolon - report the error and continue from here 
                 */
                G_tok->log_error_curtok(TCERR_LOCAL_REQ_COMMA);
                done = TRUE;
                break;
            }
        }
        else
        {
            /* symbol required - log the error */
            G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);

            /* determine how to proceed based on what we have */
            switch(G_tok->cur())
            {
            case TOKT_COMMA:
                /* 
                 *   they probably just put in an extra comma - skip it
                 *   and keep trying to parse the local list 
                 */
                G_tok->next();
                break;

            case TOKT_SEM:
                /* that's the end of the statement */
                G_tok->next();
                done = TRUE;
                break;

            case TOKT_EOF:
                /* set the error flag and stop scanning */
                *err = TRUE;
                done = TRUE;
                break;

            default:
                /* try skipping this token and trying again */
                G_tok->next();
                break;
            }
        }
    }

    /* 
     *   if we have one statement, return it; if we have more than one,
     *   return a compound statement to contain the list; if we have
     *   nothing, return nothing 
     */
    if (first_stm == 0)
        return 0;
    else if (first_stm == last_stm)
        return first_stm;
    else
        return new CTPNStmComp(first_stm, local_symtab_);
}